

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_declared_extensions
          (spvc_compiler compiler,char ***extensions,size_t *num_extensions)

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar1;
  ScratchMemoryAllocation *pSVar2;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  long lVar3;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> local_b8;
  size_t *local_b0;
  SmallVector<const_char_*,_8UL> duped;
  
  local_b0 = num_extensions;
  pSVar1 = spirv_cross::Compiler::get_declared_extensions_abi_cxx11_
                     ((compiler->compiler)._M_t.
                      super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                      .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  duped.super_VectorView<const_char_*>.ptr = (char **)&duped.stack_storage;
  duped.super_VectorView<const_char_*>.buffer_size = 0;
  duped.buffer_capacity = 8;
  spirv_cross::SmallVector<const_char_*,_8UL>::reserve
            (&duped,(pSVar1->
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).buffer_size);
  name = (pSVar1->
         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).ptr;
  for (lVar3 = (pSVar1->
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).buffer_size << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
    local_b8._M_head_impl =
         (ScratchMemoryAllocation *)spvc_context_s::allocate_name(compiler->context,name);
    spirv_cross::SmallVector<const_char_*,_8UL>::push_back(&duped,(char **)&local_b8);
    name = name + 1;
  }
  pSVar2 = (ScratchMemoryAllocation *)operator_new(0x60);
  pSVar2[10]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[0xb]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[8]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[9]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[6]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[7]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[4]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[5]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2->_vptr_ScratchMemoryAllocation = (_func_int **)&PTR__TemporaryBuffer_0039dbf8;
  pSVar2[2]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar2[1]._vptr_ScratchMemoryAllocation = (_func_int **)(pSVar2 + 4);
  pSVar2[3]._vptr_ScratchMemoryAllocation = (_func_int **)0x8;
  spirv_cross::SmallVector<const_char_*,_8UL>::operator=
            ((SmallVector<const_char_*,_8UL> *)(pSVar2 + 1),&duped);
  *extensions = (char **)pSVar2[1]._vptr_ScratchMemoryAllocation;
  *local_b0 = (size_t)pSVar2[2]._vptr_ScratchMemoryAllocation;
  local_b8._M_head_impl = pSVar2;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&compiler->context->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &local_b8);
  if (local_b8._M_head_impl != (ScratchMemoryAllocation *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_ScratchMemoryAllocation[1])();
  }
  spirv_cross::SmallVector<const_char_*,_8UL>::~SmallVector(&duped);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_declared_extensions(spvc_compiler compiler, const char ***extensions,
                                                  size_t *num_extensions)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto &exts = compiler->compiler->get_declared_extensions();
		SmallVector<const char *> duped;
		duped.reserve(exts.size());
		for (auto &ext : exts)
			duped.push_back(compiler->context->allocate_name(ext));

		auto ptr = spvc_allocate<TemporaryBuffer<const char *>>();
		ptr->buffer = std::move(duped);
		*extensions = ptr->buffer.data();
		*num_extensions = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}